

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaStr.c
# Opt level: O3

void Str_NtkBalanceMulti(Gia_Man_t *pNew,Str_Ntk_t *p,Str_Obj_t *pObj,Vec_Int_t *vDelay,int nLutSize
                        )

{
  Str_Ntk_t *p_00;
  Vec_Int_t *p_01;
  Str_Obj_t *pSuper;
  uint *pCost;
  uint uVar1;
  int iVar2;
  Str_Ntk_t *pSVar3;
  uint uVar4;
  ulong uVar5;
  int iVar6;
  uint uVar7;
  Vec_Int_t *extraout_RDX;
  Vec_Int_t *extraout_RDX_00;
  Vec_Int_t *extraout_RDX_01;
  Vec_Int_t *vDelay_00;
  Vec_Int_t *extraout_RDX_02;
  Str_Ntk_t *pSVar8;
  Vec_Int_t *extraout_RDX_03;
  long lVar10;
  ulong uVar11;
  Str_Ntk_t *p_02;
  Str_Obj_t *__base;
  Vec_Int_t *pVVar12;
  ulong uVar13;
  ulong uVar14;
  uint uVar15;
  ulong uVar16;
  int iVar17;
  ulong uVar18;
  int iVar19;
  uint uVar20;
  undefined8 uVar21;
  word pMatrix [256];
  Str_Ntk_t *pSVar9;
  
  p_00 = (Str_Ntk_t *)pNew->vSuper;
  if (p_00->nObjs < 0x100) {
    __assert_fail("Limit <= Vec_IntCap(vSuper)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaStr.c"
                  ,0x44a,
                  "void Str_NtkBalanceMulti(Gia_Man_t *, Str_Ntk_t *, Str_Obj_t *, Vec_Int_t *, int)"
                 );
  }
  p_01 = pNew->vStore;
  if (p_01->nCap < 0x100) {
    __assert_fail("Limit <= Vec_IntCap(vCosts)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaStr.c"
                  ,1099,
                  "void Str_NtkBalanceMulti(Gia_Man_t *, Str_Ntk_t *, Str_Obj_t *, Vec_Int_t *, int)"
                 );
  }
  pSuper = p_00->pObjs;
  pCost = (uint *)p_01->pArray;
  p_00->nObjsAlloc = 0;
  p_02 = (Str_Ntk_t *)0x0;
  __base = pSuper;
  if (0xf < *(uint *)pObj) {
    do {
      uVar1 = pObj->iOffset + (int)p_02;
      if (((int)uVar1 < 0) || ((p->vFanins).nSize <= (int)uVar1)) goto LAB_0078c851;
      uVar1 = (p->vFanins).pArray[uVar1];
      if ((int)uVar1 < 0) goto LAB_0078c870;
      if (p->nObjs <= (int)(uVar1 >> 1)) {
        __assert_fail("i < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaStr.c"
                      ,0x52,"Str_Obj_t *Str_NtkObj(Str_Ntk_t *, int)");
      }
      uVar7 = p->pObjs[uVar1 >> 1].iCopy;
      if ((int)uVar7 < 0) {
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/util/abc_global.h"
                      ,0x132,"int Abc_LitNotCond(int, int)");
      }
      Vec_IntPush((Vec_Int_t *)p_00,uVar7 ^ uVar1 & 1);
      uVar1 = (int)p_02 + 1;
      p_02 = (Str_Ntk_t *)(ulong)uVar1;
    } while (uVar1 < *(uint *)pObj >> 4);
    p_02 = (Str_Ntk_t *)(long)p_00->nObjsAlloc;
    __base = p_00->pObjs;
  }
  qsort(__base,(size_t)p_02,4,Vec_IntSortCompare1);
  if (((undefined1  [16])*pObj & (undefined1  [16])0xf) == (undefined1  [16])0x3) {
    iVar2 = 0x78c191;
    Gia_ManSimplifyAnd((Vec_Int_t *)p_00);
    vDelay_00 = extraout_RDX;
  }
  else {
    iVar2 = 0x78c1a0;
    Gia_ManSimplifyXor((Vec_Int_t *)p_00);
    vDelay_00 = extraout_RDX_00;
  }
  iVar6 = p_00->nObjsAlloc;
  if (iVar6 < 1) {
    __assert_fail("Vec_IntSize(vSuper) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaStr.c"
                  ,0x456,
                  "void Str_NtkBalanceMulti(Gia_Man_t *, Str_Ntk_t *, Str_Obj_t *, Vec_Int_t *, int)"
                 );
  }
  if (iVar6 != 2) {
    if (iVar6 == 1) {
      iVar2 = *(int *)p_00->pObjs;
      goto LAB_0078c83b;
    }
    p_01->nSize = 0;
    if (p_00->nObjsAlloc < 1) {
LAB_0078c29a:
      uVar21 = 0x78c2b2;
      p_02 = p_00;
      Str_ManVectorAffinity(pNew,(Vec_Int_t *)p_00,vDelay_00,pMatrix,0x100);
      iVar2 = (int)uVar21;
      uVar1 = p_00->nObjsAlloc;
      vDelay_00 = extraout_RDX_02;
      if ((int)uVar1 < 3) goto LAB_0078c80e;
    }
    else {
      lVar10 = 0;
      do {
        uVar1 = *(uint *)((long)&p_00->pObjs->field_0x0 + lVar10 * 4);
        if ((int)uVar1 < 0) {
LAB_0078c870:
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/util/abc_global.h"
                        ,0x12f,"int Abc_Lit2Var(int)");
        }
        uVar1 = uVar1 >> 1;
        if (vDelay->nSize <= (int)uVar1) {
LAB_0078c851:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        uVar21 = 0x78c20e;
        Vec_IntPush(p_01,vDelay->pArray[uVar1]);
        lVar10 = lVar10 + 1;
        iVar2 = p_00->nObjsAlloc;
      } while (lVar10 < iVar2);
      vDelay_00 = extraout_RDX_01;
      if (iVar2 < 2) goto LAB_0078c29a;
      vDelay_00 = (Vec_Int_t *)0x1;
      p_02 = (Str_Ntk_t *)0x0;
      do {
        uVar5 = (ulong)p_02 & 0xffffffff;
        pVVar12 = vDelay_00;
        do {
          uVar1 = (uint)pVVar12;
          if ((int)pCost[(int)(uint)uVar5] <= (int)pCost[(long)pVVar12]) {
            uVar1 = (uint)uVar5;
          }
          pVVar12 = (Vec_Int_t *)((long)&pVVar12->nCap + 1);
          uVar5 = (ulong)uVar1;
        } while ((Vec_Int_t *)(long)iVar2 != pVVar12);
        iVar6 = *(int *)((long)&pSuper->field_0x0 + p_02 * 4);
        *(int *)((long)&pSuper->field_0x0 + p_02 * 4) =
             *(int *)((long)&pSuper->field_0x0 + (long)(int)uVar1 * 4);
        *(int *)((long)&pSuper->field_0x0 + (long)(int)uVar1 * 4) = iVar6;
        uVar7 = pCost[(long)p_02];
        pCost[(long)p_02] = pCost[(int)uVar1];
        p_02 = (Str_Ntk_t *)((long)&p_02->nObjs + 1);
        pCost[(int)uVar1] = uVar7;
        vDelay_00 = (Vec_Int_t *)((long)&vDelay_00->nCap + 1);
      } while (p_02 != (Str_Ntk_t *)(ulong)(iVar2 - 1));
      uVar1 = p_00->nObjsAlloc;
      if ((int)uVar1 < 0x40) goto LAB_0078c29a;
    }
    do {
      pSVar3 = (Str_Ntk_t *)(ulong)uVar1;
      if (uVar1 < 0x41) {
        if (uVar1 == 0x40) {
          uVar21 = 0x78c313;
          p_02 = p_00;
          Str_ManVectorAffinity(pNew,(Vec_Int_t *)p_00,vDelay_00,pMatrix,0x100);
          pSVar3 = (Str_Ntk_t *)(ulong)(uint)p_00->nObjsAlloc;
          if (0x40 < p_00->nObjsAlloc) {
            __assert_fail("Vec_IntSize(vSuper) <= 64",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaStr.c"
                          ,0x47f,
                          "void Str_NtkBalanceMulti(Gia_Man_t *, Str_Ntk_t *, Str_Obj_t *, Vec_Int_t *, int)"
                         );
          }
        }
        uVar1 = *pCost;
        if ((uVar1 == 0x11) && (pCost[1] == 0x11)) {
          uVar7 = 1;
        }
        else {
          iVar2 = (int)pSVar3;
          if (iVar2 < 1) {
            if (nLutSize == -1) {
LAB_0078c8d3:
              __assert_fail("iBest > 0 && iBest < Vec_IntSize(vSuper)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaStr.c"
                            ,0x4af,
                            "void Str_NtkBalanceMulti(Gia_Man_t *, Str_Ntk_t *, Str_Obj_t *, Vec_Int_t *, int)"
                           );
            }
            goto LAB_0078c8f2;
          }
          pSVar8 = (Str_Ntk_t *)0x0;
          do {
            pSVar9 = pSVar8;
            if (0xf < (pCost[(long)pSVar8] ^ uVar1)) break;
            pSVar8 = (Str_Ntk_t *)((long)&pSVar8->nObjs + 1);
            pSVar9 = pSVar3;
          } while (pSVar3 != pSVar8);
          iVar6 = (int)pSVar9;
          if (iVar6 != 1) {
            uVar5 = (ulong)pSVar9 & 0xffffffff;
            if (iVar6 == 0) {
              uVar7 = 0xffffffff;
              iVar17 = -1;
            }
            else {
              uVar4 = 0xffffffff;
              uVar16 = 1;
              iVar17 = -1;
              uVar14 = 0xffffffff;
              do {
                iVar19 = (pCost[uVar16] & 0xf) + (uVar1 & 0xf);
                if (iVar19 <= nLutSize) {
                  uVar11 = pMatrix[uVar16] & pMatrix[0];
                  if (uVar11 == 0) {
                    uVar7 = 0;
                  }
                  else {
                    uVar11 = uVar11 - 1 & uVar11;
                    if (uVar11 == 0) {
                      uVar7 = 1;
                    }
                    else {
                      uVar11 = uVar11 - 1 & uVar11;
                      if (uVar11 == 0) {
                        uVar7 = 2;
                      }
                      else {
                        uVar11 = uVar11 - (uVar11 >> 1 & 0x5555555555555555);
                        uVar11 = (uVar11 >> 2 & 0x3333333333333333) + (uVar11 & 0x3333333333333333);
                        uVar7 = (uint)(byte)(((uVar11 >> 4) + uVar11 & 0xf0f0f0f0f0f0f0f) *
                                             0x101010101010101 >> 0x38);
                      }
                    }
                  }
                  if ((iVar17 < iVar19) || ((iVar17 == iVar19 && ((int)uVar4 < (int)uVar7)))) {
                    uVar14 = uVar16 & 0xffffffff;
                    iVar17 = iVar19;
                    uVar4 = uVar7;
                  }
                }
                uVar7 = (uint)uVar14;
                uVar16 = uVar16 + 1;
                p_02 = (Str_Ntk_t *)pMatrix[0];
              } while (uVar5 != uVar16);
            }
            if (iVar17 == nLutSize) {
              if (((int)uVar7 < 1) || (iVar2 <= (int)uVar7)) goto LAB_0078c8d3;
              uVar4 = 0;
            }
            else {
              if (iVar6 == 0) {
LAB_0078c8f2:
                __assert_fail("iBest2 > 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaStr.c"
                              ,0x4d0,
                              "void Str_NtkBalanceMulti(Gia_Man_t *, Str_Ntk_t *, Str_Obj_t *, Vec_Int_t *, int)"
                             );
              }
              uVar1 = 0xffffffff;
              uVar14 = 1;
              uVar4 = 0xffffffff;
              iVar2 = -1;
              iVar6 = -1;
              uVar7 = 0xffffffff;
              p_02 = (Str_Ntk_t *)0xffffffff;
              uVar16 = 0;
              do {
                uVar11 = uVar16 + 1;
                if (uVar11 < uVar5) {
                  uVar15 = (int)uVar16 << 0x10;
                  uVar13 = uVar14;
                  do {
                    uVar18 = pMatrix[uVar13] & pMatrix[uVar16];
                    if (uVar18 == 0) {
                      uVar20 = 0;
                    }
                    else {
                      uVar18 = uVar18 - 1 & uVar18;
                      if (uVar18 == 0) {
                        uVar20 = 1;
                      }
                      else {
                        uVar18 = uVar18 - 1 & uVar18;
                        if (uVar18 == 0) {
                          uVar20 = 2;
                        }
                        else {
                          uVar18 = uVar18 - (uVar18 >> 1 & 0x5555555555555555);
                          uVar18 = (uVar18 >> 2 & 0x3333333333333333) +
                                   (uVar18 & 0x3333333333333333);
                          uVar20 = (uint)(byte)(((uVar18 >> 4) + uVar18 & 0xf0f0f0f0f0f0f0f) *
                                                0x101010101010101 >> 0x38);
                        }
                      }
                    }
                    iVar17 = (pCost[uVar13] & 0xf) + (pCost[uVar16] & 0xf);
                    if (nLutSize < iVar17) {
                      if (((int)uVar1 < (int)uVar20) || ((uVar1 == uVar20 && (iVar2 < iVar17)))) {
                        uVar7 = uVar15 | (uint)uVar13;
                        uVar1 = uVar20;
                        iVar2 = iVar17;
                      }
                    }
                    else if (((int)uVar4 < (int)uVar20) || ((uVar4 == uVar20 && (iVar6 < iVar17))))
                    {
                      p_02 = (Str_Ntk_t *)(ulong)(uVar15 | (uint)uVar13);
                      uVar4 = uVar20;
                      iVar6 = iVar17;
                    }
                    uVar13 = uVar13 + 1;
                  } while (uVar5 != uVar13);
                }
                uVar14 = uVar14 + 1;
                uVar16 = uVar11;
              } while (uVar11 != uVar5);
              uVar1 = (uint)p_02;
              if ((int)uVar1 < 0) {
                if ((int)uVar7 < 1) goto LAB_0078c8f2;
                uVar4 = uVar7 >> 0x10;
              }
              else {
                if (uVar1 == 0) {
                  __assert_fail("iBest > 0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaStr.c"
                                ,0x4c9,
                                "void Str_NtkBalanceMulti(Gia_Man_t *, Str_Ntk_t *, Str_Obj_t *, Vec_Int_t *, int)"
                               );
                }
                uVar4 = (uint)((ulong)p_02 >> 0x10);
                uVar7 = uVar1;
              }
              uVar7 = uVar7 & 0xffff;
            }
            goto LAB_0078c7e0;
          }
          uVar5 = pMatrix[1] & pMatrix[0];
          if (uVar5 == 0) {
            uVar5 = 0;
          }
          else {
            p_02 = (Str_Ntk_t *)(uVar5 - 1 & uVar5);
            if (p_02 == (Str_Ntk_t *)0x0) {
              uVar5 = 1;
            }
            else {
              uVar5 = (ulong)&p_02[-1].field_0x4f & (ulong)p_02;
              if (uVar5 == 0) {
                uVar5 = 2;
              }
              else {
                uVar5 = uVar5 - (uVar5 >> 1 & 0x5555555555555555);
                p_02 = (Str_Ntk_t *)0x3333333333333333;
                uVar5 = (uVar5 >> 2 & 0x3333333333333333) + (uVar5 & 0x3333333333333333);
                uVar5 = ((uVar5 >> 4) + uVar5 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >> 0x38;
              }
            }
          }
          uVar16 = 1;
          uVar7 = 1;
          if (2 < iVar2) {
            p_02 = (Str_Ntk_t *)0x2;
            do {
              uVar7 = (uint)uVar16;
              if (0xf < (pCost[(long)p_02] ^ pCost[1])) break;
              uVar14 = pMatrix[(long)p_02] & pMatrix[0];
              if (uVar14 == 0) {
                uVar1 = 0;
              }
              else {
                uVar14 = uVar14 - 1 & uVar14;
                if (uVar14 == 0) {
                  uVar1 = 1;
                }
                else {
                  uVar14 = uVar14 - 1 & uVar14;
                  if (uVar14 == 0) {
                    uVar1 = 2;
                  }
                  else {
                    uVar14 = uVar14 - (uVar14 >> 1 & 0x5555555555555555);
                    uVar14 = (uVar14 >> 2 & 0x3333333333333333) + (uVar14 & 0x3333333333333333);
                    uVar1 = (uint)(byte)(((uVar14 >> 4) + uVar14 & 0xf0f0f0f0f0f0f0f) *
                                         0x101010101010101 >> 0x38);
                  }
                }
              }
              if ((uint)uVar5 < uVar1) {
                uVar16 = (ulong)p_02 & 0xffffffff;
              }
              uVar7 = (uint)uVar16;
              if ((uint)uVar5 <= uVar1) {
                uVar5 = (ulong)uVar1;
              }
              p_02 = (Str_Ntk_t *)((long)&p_02->nObjs + 1);
            } while (pSVar3 != p_02);
          }
          if (((int)uVar7 < 1) || (iVar2 <= (int)uVar7)) {
            __assert_fail("iBest > 0 && iBest < Vec_IntSize(vSuper)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaStr.c"
                          ,0x49b,
                          "void Str_NtkBalanceMulti(Gia_Man_t *, Str_Ntk_t *, Str_Obj_t *, Vec_Int_t *, int)"
                         );
          }
        }
        uVar4 = 0;
      }
      else {
        uVar4 = 0;
        uVar7 = 1;
      }
LAB_0078c7e0:
      Str_NtkBalanceTwo(pNew,p_02,pObj,uVar4,uVar7,vDelay,(int *)pCost,(int *)pSuper,pMatrix,
                        (int)pSVar3,nLutSize,(int)uVar21);
      iVar2 = (int)uVar21;
      p_00->nObjsAlloc = p_00->nObjsAlloc + -1;
      p_01->nSize = p_01->nSize + -1;
      uVar1 = p_00->nObjsAlloc;
      vDelay_00 = extraout_RDX_03;
    } while (2 < (int)uVar1);
  }
LAB_0078c80e:
  iVar2 = Str_NtkBalanceTwo(pNew,p_02,pObj,0,1,vDelay,(int *)pCost,(int *)pSuper,pMatrix,2,nLutSize,
                            iVar2);
LAB_0078c83b:
  pObj->iCopy = iVar2;
  return;
}

Assistant:

void Str_NtkBalanceMulti( Gia_Man_t * pNew, Str_Ntk_t * p, Str_Obj_t * pObj, Vec_Int_t * vDelay, int nLutSize )
{
    word pMatrix[256];
    int Limit = 256;
    Vec_Int_t * vSuper = pNew->vSuper;
    Vec_Int_t * vCosts = pNew->vStore;
    int * pSuper = Vec_IntArray(vSuper);
    int * pCost  = Vec_IntArray(vCosts);
    int k, iLit, MatrixSize = 0;
    assert( Limit <= Vec_IntCap(vSuper) );
    assert( Limit <= Vec_IntCap(vCosts) );

    // collect nodes
    Vec_IntClear( vSuper );
    for ( k = 0; k < (int)pObj->nFanins; k++ )
        Vec_IntPush( vSuper, Str_ObjFaninCopy(p, pObj, k) );
    Vec_IntSort( vSuper, 0 );
    if ( pObj->Type == STR_AND )
        Gia_ManSimplifyAnd( vSuper );
    else
        Gia_ManSimplifyXor( vSuper );
    assert( Vec_IntSize(vSuper) > 0 );
    if ( Vec_IntSize(vSuper) == 1 )
    {
        pObj->iCopy = Vec_IntEntry(vSuper, 0);
        return;
    }
    if ( Vec_IntSize(vSuper) == 2 )
    {
        pObj->iCopy = Str_NtkBalanceTwo( pNew, p, pObj, 0, 1, vDelay, pCost, pSuper, pMatrix, 2, nLutSize, -1 );
        return;
    }

    // sort by cost
    Vec_IntClear( vCosts );
    Vec_IntForEachEntry( vSuper, iLit, k )
        Vec_IntPush( vCosts, Vec_IntEntry(vDelay, Abc_Lit2Var(iLit)) );
    Vec_IntSelectSortCost2( pSuper, Vec_IntSize(vSuper), pCost );

    // compute affinity
    if ( Vec_IntSize(vSuper) < 64 )
        MatrixSize = Str_ManVectorAffinity( pNew, vSuper, vCosts, pMatrix, Limit );

    // start the new product
    while ( Vec_IntSize(vSuper) > 2 )
    {
        // pair the first entry with another one on the same level
        int i, iStop, iBest,iBest2;
        int CostNew, CostBest, CostBest2;
        int OccurNew, OccurBest, OccurBest2;

        if ( Vec_IntSize(vSuper) > 64 )
        {
            Str_NtkBalanceTwo( pNew, p, pObj, 0, 1, vDelay, pCost, pSuper, pMatrix, Vec_IntSize(vSuper), nLutSize, -1 );
            vSuper->nSize--;
            vCosts->nSize--;
            continue;
        }

        // compute affinity
        if ( Vec_IntSize(vSuper) == 64 )
            MatrixSize = Str_ManVectorAffinity( pNew, vSuper, vCosts, pMatrix, Limit );
        assert( Vec_IntSize(vSuper) <= 64 );
//        Str_PrintState( pCost, pSuper, pMatrix, Vec_IntSize(vSuper) );

        // if the first two are PIs group them
        if ( pCost[0] == 17 && pCost[1] == 17 )
        {
            Str_NtkBalanceTwo( pNew, p, pObj, 0, 1, vDelay, pCost, pSuper, pMatrix, Vec_IntSize(vSuper), nLutSize, 2 );
            vSuper->nSize--;
            vCosts->nSize--;
            continue;
        }

        // find the end of the level
        for ( iStop = 0; iStop < Vec_IntSize(vSuper); iStop++ )
            if ( (pCost[iStop] >> 4) != (pCost[0] >> 4) )
                break;
        // if there is only one this level, pair it with the best match in the next level
        if ( iStop == 1 )
        {
            iBest = iStop, OccurBest = Str_CountBits(pMatrix[0] & pMatrix[iStop]);
            for ( i = iStop + 1; i < Vec_IntSize(vSuper); i++ )
            {
                if ( (pCost[i] >> 4) != (pCost[iStop] >> 4) )
                    break;
                OccurNew = Str_CountBits(pMatrix[0] & pMatrix[i]);
                if ( OccurBest < OccurNew )
                    iBest = i, OccurBest = OccurNew;
            }
            assert( iBest > 0 && iBest < Vec_IntSize(vSuper) );
            Str_NtkBalanceTwo( pNew, p, pObj, 0, iBest, vDelay, pCost, pSuper, pMatrix, Vec_IntSize(vSuper), nLutSize, -1 );
            vSuper->nSize--;
            vCosts->nSize--;
            continue;
        }
        // pair the first entry with another one on the same level
        iBest = -1; CostBest = -1; OccurBest2 = -1; OccurBest = -1;
        for ( i = 1; i < iStop; i++ )
        {
            CostNew = (pCost[0] & 15) + (pCost[i] & 15);
            if ( CostNew > nLutSize )
                continue;
            OccurNew = Str_CountBits(pMatrix[0] & pMatrix[i]);
            if ( CostBest < CostNew || (CostBest == CostNew && OccurBest < OccurNew) )
                CostBest = CostNew, iBest = i, OccurBest = OccurNew;
        }
        // if the best found is perfect, take it
        if ( CostBest == nLutSize )
        {
            assert( iBest > 0 && iBest < Vec_IntSize(vSuper) );
            Str_NtkBalanceTwo( pNew, p, pObj, 0, iBest, vDelay, pCost, pSuper, pMatrix, Vec_IntSize(vSuper), nLutSize, CostBest );
            vSuper->nSize--;
            vCosts->nSize--;
            continue;
        }
        // find the best pair on this level
        iBest = iBest2 = -1; CostBest = CostBest2 = -1, OccurBest = OccurBest2 = -1;
        for ( i = 0; i < iStop; i++ )
        for ( k = i+1; k < iStop; k++ )
        {
            CostNew  = (pCost[i] & 15) + (pCost[k] & 15);
            OccurNew = Str_CountBits(pMatrix[i] & pMatrix[k]);
            if ( CostNew <= nLutSize ) // the same level
            {
                if ( OccurBest < OccurNew || (OccurBest == OccurNew && CostBest < CostNew ))
                    CostBest = CostNew, iBest = (i << 16) | k, OccurBest = OccurNew;
            }
            else // overflow to the next level
            {
                if ( OccurBest2 < OccurNew || (OccurBest2 == OccurNew && CostBest2 < CostNew) )
                    CostBest2 = CostNew, iBest2 = (i << 16) | k, OccurBest2 = OccurNew;
            }
        }
        if ( iBest >= 0 )
        {
            assert( iBest > 0 );
            Str_NtkBalanceTwo( pNew, p, pObj, iBest>>16, iBest&0xFFFF, vDelay, pCost, pSuper, pMatrix, Vec_IntSize(vSuper), nLutSize, CostBest );
            vSuper->nSize--;
            vCosts->nSize--;
            continue;
        }
        // take any remaining pair
        assert( iBest2 > 0 );
        Str_NtkBalanceTwo( pNew, p, pObj, iBest2>>16, iBest2&0xFFFF, vDelay, pCost, pSuper, pMatrix, Vec_IntSize(vSuper), nLutSize, -1 );
        vSuper->nSize--;
        vCosts->nSize--;
        continue;
    }
    pObj->iCopy = Str_NtkBalanceTwo( pNew, p, pObj, 0, 1, vDelay, pCost, pSuper, pMatrix, 2, nLutSize, -1 );

/*
    // simple
    pObj->iCopy = (pObj->Type == STR_AND);
    for ( k = 0; k < Vec_IntSize(vSuper); k++ )
    {
        if ( pObj->Type == STR_AND )
            pObj->iCopy = Gia_ManHashAnd( pNew, pObj->iCopy, Vec_IntEntry(vSuper, k) );
        else
            pObj->iCopy = Gia_ManHashXorReal( pNew, pObj->iCopy, Vec_IntEntry(vSuper, k) );
        Str_ObjDelay( pNew, Abc_Lit2Var(pObj->iCopy), nLutSize, vDelay );
    }
*/
}